

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem.c
# Opt level: O3

coda_dynamic_type * coda_no_data_singleton(coda_format format)

{
  coda_mem_special *pcVar1;
  long in_FS_OFFSET;
  
  if ((coda_format_rinex|coda_format_xml) < format) {
    __assert_fail("format < num_no_data_singletons",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem.c"
                  ,0x3d,"coda_dynamic_type *coda_no_data_singleton(coda_format)");
  }
  pcVar1 = *(coda_mem_special **)(in_FS_OFFSET + (ulong)format * 8 + -0x170);
  if (pcVar1 == (coda_mem_special *)0x0) {
    pcVar1 = coda_mem_no_data_new(format);
    *(coda_mem_special **)(in_FS_OFFSET + (ulong)format * 8 + -0x170) = pcVar1;
    if (pcVar1 == (coda_mem_special *)0x0) {
      __assert_fail("no_data_singleton[format] != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem.c"
                    ,0x41,"coda_dynamic_type *coda_no_data_singleton(coda_format)");
    }
  }
  return (coda_dynamic_type *)pcVar1;
}

Assistant:

coda_dynamic_type *coda_no_data_singleton(coda_format format)
{
    assert(format < num_no_data_singletons);
    if (no_data_singleton[format] == NULL)
    {
        no_data_singleton[format] = coda_mem_no_data_new(format);
        assert(no_data_singleton[format] != NULL);
    }

    return (coda_dynamic_type *)no_data_singleton[format];
}